

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

void nn_global_reset_all_socket_locks(void)

{
  int iVar1;
  nn_ctx *self;
  nn_ctx *ctx;
  int i;
  
  iVar1 = nn_is_glock_held();
  if (iVar1 != 0) {
    if ((::self.socks != (nn_sock **)0x0) && (::self.nsocks != 0)) {
      for (ctx._4_4_ = 0; ctx._4_4_ != 0x200; ctx._4_4_ = ctx._4_4_ + 1) {
        if (::self.socks[ctx._4_4_] != (nn_sock *)0x0) {
          self = nn_sock_getctx(::self.socks[ctx._4_4_]);
          nn_mutex_reset(&self->sync);
        }
      }
    }
    return;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_is_glock_held()",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/global.c"
          ,0x4a6);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_global_reset_all_socket_locks (void)
{
    int i;
    struct nn_ctx *ctx;
    nn_assert(nn_is_glock_held());

    if (self.socks && self.nsocks) {
        for (i = 0; i != NN_MAX_SOCKETS; ++i)
            if (self.socks [i]) {
                ctx = nn_sock_getctx (self.socks [i]);
                nn_mutex_reset (&ctx->sync);
            }
    }
}